

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_osd.cpp
# Opt level: O1

char * __thiscall bp_osd::bp_osd_decode(bp_osd *this,char *synd)

{
  uint uVar1;
  char *pcVar2;
  char **ppcVar3;
  ostream *poVar4;
  long lVar5;
  
  pcVar2 = bp_decode(this,synd);
  this->bp_decoding = pcVar2;
  if (*this->converge == 0) {
    uVar1 = this->osd_method;
    if (uVar1 < 2) {
      osd_w(this->H,synd,this->osd0_decoding,this->osdw_decoding,this->log_prob_ratios,
            this->osd_order,this->rank,this->osd_w_encoding_inputs,(int)this->encoding_input_count);
    }
    else if (uVar1 == 2) {
      osd_0(this->H,synd,this->osd0_decoding,this->log_prob_ratios,this->rank);
      this->osdw_decoding = this->osd0_decoding;
    }
    else {
      if (uVar1 != 3) {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "ERROR. <Function bp_osd::bp_osd_decode>. Invalid OSD method! Method: "
                                );
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->osd_method);
        std::endl<char,std::char_traits<char>>(poVar4);
        exit(0x16);
      }
      osd_g(this->H,synd,this->osd0_decoding,this->osdw_decoding,this->log_prob_ratios,
            this->osd_order,this->rank);
    }
    ppcVar3 = &this->osdw_decoding;
  }
  else {
    ppcVar3 = &this->bp_decoding;
    if (0 < this->N) {
      lVar5 = 0;
      do {
        this->osd0_decoding[lVar5] = this->bp_decoding[lVar5];
        this->osdw_decoding[lVar5] = this->bp_decoding[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->N);
    }
  }
  return *ppcVar3;
}

Assistant:

char *bp_osd::bp_osd_decode(char *synd) {

    bp_decoding=bp_decode(synd);

    if(*converge){
        for(int i=0;i<N;i++) {
            osd0_decoding[i] = bp_decoding[i];
            osdw_decoding[i] = bp_decoding[i];
        }
        return bp_decoding;
    }

    if((osd_method==0)||(osd_method==1))
        osd_w(
                H,
                synd,
                osd0_decoding,
                osdw_decoding,
                log_prob_ratios,
                osd_order, rank,
                osd_w_encoding_inputs,
                encoding_input_count
        );

    else if(osd_method==2){
        osd_0(
                H,
                synd,
                osd0_decoding,
                log_prob_ratios,
                rank
                );
        osdw_decoding=osd0_decoding;
    }

    else if(osd_method==3){
        osd_g(
                H,
                synd,
                osd0_decoding,
                osdw_decoding,
                log_prob_ratios,
                osd_order,
                rank
        );
    }

    else {
        cout << "ERROR. <Function bp_osd::bp_osd_decode>. Invalid OSD method! Method: "<<osd_method << endl;
        exit(22);
    }

//    test_correct_synd(osd0_decoding,synd);
//    test_correct_synd(osdw_decoding,synd);

//    osd0_decoding=osd_data[0].decoding;
//    osdw_decoding=osd_data[1].decoding;

    return osdw_decoding;

}